

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O0

uint32_t nd_mul2k(uint32_t *nd,uint32_t ndhi,uint32_t k,uint32_t carry_in,SFormat sf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  ulong uVar3;
  uint32_t uVar4;
  bool bVar5;
  uint64_t val_1;
  uint64_t val;
  uint32_t start;
  uint32_t ndlo;
  uint32_t i;
  SFormat sf_local;
  uint32_t carry_in_local;
  uint32_t k_local;
  uint32_t ndhi_local;
  uint32_t *nd_local;
  
  ndlo = 0;
  start = 1;
  carry_in_local = carry_in;
  k_local = k;
  ndhi_local = ndhi;
  if ((0x3a < k) && ((sf >> 4 & 3) != 2)) {
    start = ndhi - ((sf >> 0x18) + 0x10 >> 3);
  }
  for (; 0x1c < k_local; k_local = k_local - 0x1d) {
    for (i = ndlo; i <= ndhi_local; i = i + 1) {
      uVar3 = (ulong)nd[i] << 0x1d | (ulong)carry_in_local;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      carry_in_local = SUB164(auVar1 / ZEXT816(1000000000),0);
      nd[i] = (int)uVar3 + carry_in_local * -1000000000;
    }
    if (carry_in_local != 0) {
      ndhi_local = ndhi_local + 1;
      nd[ndhi_local] = carry_in_local;
      carry_in_local = 0;
      uVar4 = start + 1;
      bVar5 = start == ndlo;
      start = uVar4;
      if (bVar5) {
        ndlo = ndlo + 1;
      }
    }
  }
  if (k_local != 0) {
    for (i = ndlo; i <= ndhi_local; i = i + 1) {
      uVar3 = (ulong)nd[i] << ((byte)k_local & 0x3f) | (ulong)carry_in_local;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar3;
      carry_in_local = SUB124(auVar2 / ZEXT812(1000000000),0);
      nd[i] = (int)uVar3 + carry_in_local * -1000000000;
    }
    if (carry_in_local != 0) {
      ndhi_local = ndhi_local + 1;
      nd[ndhi_local] = carry_in_local;
    }
  }
  return ndhi_local;
}

Assistant:

static uint32_t nd_mul2k(uint32_t* nd, uint32_t ndhi, uint32_t k,
			 uint32_t carry_in, SFormat sf)
{
  uint32_t i, ndlo = 0, start = 1;
  /* Performance hacks. */
  if (k > ND_MUL2K_MAX_SHIFT*2 && STRFMT_FP(sf) != STRFMT_FP(STRFMT_T_FP_F)) {
    start = ndhi - (STRFMT_PREC(sf) + 17) / 8;
  }
  /* Real logic. */
  while (k >= ND_MUL2K_MAX_SHIFT) {
    for (i = ndlo; i <= ndhi; i++) {
      uint64_t val = ((uint64_t)nd[i] << ND_MUL2K_MAX_SHIFT) | carry_in;
      carry_in = ND_MUL2K_DIV1E9(val);
      nd[i] = (uint32_t)val - carry_in * 1000000000;
    }
    if (carry_in) {
      nd[++ndhi] = carry_in; carry_in = 0;
      if (start++ == ndlo) ++ndlo;
    }
    k -= ND_MUL2K_MAX_SHIFT;
  }
  if (k) {
    for (i = ndlo; i <= ndhi; i++) {
      uint64_t val = ((uint64_t)nd[i] << k) | carry_in;
      carry_in = ND_MUL2K_DIV1E9(val);
      nd[i] = (uint32_t)val - carry_in * 1000000000;
    }
    if (carry_in) nd[++ndhi] = carry_in;
  }
  return ndhi;
}